

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::pnm_observer>
::store_if_better(solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::pnm_observer>
                  *this,bit_array *x,double current,long i)

{
  double dVar1;
  
  if (current < (this->m_best).value) {
    bit_array_impl::operator=((bit_array_impl *)&this->m_best,&x->super_bit_array_impl);
    dVar1 = duration(this);
    (this->m_best).duration = dVar1;
    (this->m_best).loop = i;
    (this->m_best).remaining_constraints = 0;
    (this->m_best).value = current;
  }
  return;
}

Assistant:

void store_if_better(const bit_array& x, double current, long int i)
    {
        if (is_better_solution<Mode>(current, m_best.value)) {
            m_best.x = x;
            m_best.duration = duration();
            m_best.loop = i;
            m_best.remaining_constraints = 0;
            m_best.value = current;
        }
    }